

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

void __thiscall ON_SN_BLOCK::CullBlockHelper(ON_SN_BLOCK *this)

{
  SN_ELEMENT **ppSVar1;
  ON__UINT64 *pOVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ON__UINT64 OVar6;
  undefined8 uVar7;
  MAP_VALUE *pMVar8;
  ON__UINT32 OVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  ON__UINT32 OVar12;
  ulong uVar13;
  uint uVar14;
  ON__UINT8 *pOVar15;
  ulong uVar16;
  SN_ELEMENT *pSVar17;
  ulong uVar18;
  
  uVar3 = this->m_count;
  pOVar15 = &this->m_sn[0].m_sn_active;
  uVar13 = 0;
  while( true ) {
    if (uVar3 == uVar13) {
      return;
    }
    if (*pOVar15 == '\0') break;
    uVar13 = uVar13 + 1;
    pOVar15 = pOVar15 + 0x38;
  }
  uVar16 = uVar13 & 0xffffffff;
  while( true ) {
    uVar14 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar14;
    OVar12 = (ON__UINT32)uVar13;
    if (uVar3 <= uVar14) break;
    if (this->m_sn[uVar14].m_sn_active != '\0') {
      pSVar17 = this->m_sn + uVar14;
      uVar18 = uVar13 & 0xffffffff;
      uVar13 = (ulong)(OVar12 + 1);
      this->m_sn[uVar18].m_value.m_u = (pSVar17->m_value).m_u;
      uVar14 = (pSVar17->m_id).Data1;
      uVar10 = (pSVar17->m_id).Data2;
      uVar11 = (pSVar17->m_id).Data3;
      uVar4 = *(undefined4 *)(pSVar17->m_id).Data4;
      uVar5 = *(undefined4 *)((pSVar17->m_id).Data4 + 4);
      OVar6 = pSVar17->m_sn;
      uVar7 = *(undefined8 *)&pSVar17->m_sn_active;
      OVar12 = (pSVar17->m_value).m_u_type;
      OVar9 = (pSVar17->m_value).m_u32;
      ppSVar1 = &this->m_sn[uVar18].m_next;
      *ppSVar1 = pSVar17->m_next;
      pMVar8 = (MAP_VALUE *)(ppSVar1 + 1);
      pMVar8->m_u_type = OVar12;
      pMVar8->m_u32 = OVar9;
      pOVar2 = &this->m_sn[uVar18].m_sn;
      *pOVar2 = OVar6;
      pOVar2[1] = uVar7;
      pSVar17 = this->m_sn + uVar18;
      (pSVar17->m_id).Data1 = uVar14;
      (pSVar17->m_id).Data2 = uVar10;
      (pSVar17->m_id).Data3 = uVar11;
      *(undefined4 *)(pSVar17->m_id).Data4 = uVar4;
      *(undefined4 *)((pSVar17->m_id).Data4 + 4) = uVar5;
    }
  }
  if (OVar12 != 0) {
    this->m_count = OVar12;
    this->m_purged = 0;
    if (this->m_sorted != 0) {
      this->m_sn0 = this->m_sn[0].m_sn;
      this->m_sn1 = this->m_sn[OVar12 - 1].m_sn;
    }
    return;
  }
  this->m_count = 0;
  this->m_purged = 0;
  this->m_sorted = 1;
  this->m_sn0 = 0;
  this->m_sn1 = 0;
  return;
}

Assistant:

void ON_SN_BLOCK::CullBlockHelper()
{
  // Search the m_an[] array for elements whose m_u_type
  // value is zero and remove them from the array.
  //
  // This is a high speed helper function.  
  // The calling function must verify m_purged > 0.
  //
  // This function removes all m_sn[] elements
  // that have 0 == m_sn_active.

  ON__UINT32 i, j;
  for (i = 0; i < m_count; i++ )
  {
    if ( 0 == m_sn[i].m_sn_active )
    {
      for ( j = i+1; j < m_count; j++ )
      {
        if ( m_sn[j].m_sn_active )
        {
          m_sn[i++] = m_sn[j];
        }
      }
      if ( 0 == i )
      {
        EmptyBlock();
      }
      else
      {
        m_count = i;
        m_purged = 0;
        if ( m_sorted )
        {
          m_sn0 = m_sn[0].m_sn;
          m_sn1 = m_sn[m_count-1].m_sn;
        }
      }
      break;
    }
  }
}